

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O0

PSocketAddress * p_socket_address_new_from_native(pconstpointer native,psize len)

{
  puint16 family;
  PSocketAddress *ret;
  psize len_local;
  pconstpointer native_local;
  
  if (native == (pconstpointer)0x0 || len == 0) {
    native_local = (pconstpointer)0x0;
  }
  else {
    native_local = p_malloc0(0x20);
    if ((undefined4 *)native_local == (undefined4 *)0x0) {
      native_local = (pconstpointer)0x0;
    }
    else if (*native == 2) {
      if (len < 0x10) {
        printf("** Warning: %s **\n",
               "PSocketAddress::p_socket_address_new_from_native: invalid IPv4 native size");
        p_free(native_local);
        native_local = (pconstpointer)0x0;
      }
      else {
        *(undefined4 *)((long)native_local + 4) = *(undefined4 *)((long)native + 4);
        *(undefined4 *)native_local = 2;
        *(ushort *)((long)native_local + 0x14) =
             *(ushort *)((long)native + 2) >> 8 | *(short *)((long)native + 2) << 8;
      }
    }
    else if (*native == 10) {
      if (len < 0x1c) {
        printf("** Warning: %s **\n",
               "PSocketAddress::p_socket_address_new_from_native: invalid IPv6 native size");
        p_free(native_local);
        native_local = (pconstpointer)0x0;
      }
      else {
        *(undefined8 *)((long)native_local + 4) = *(undefined8 *)((long)native + 8);
        *(undefined8 *)((long)native_local + 0xc) = *(undefined8 *)((long)native + 0x10);
        *(undefined4 *)native_local = 10;
        *(ushort *)((long)native_local + 0x14) =
             *(ushort *)((long)native + 2) >> 8 | *(short *)((long)native + 2) << 8;
        *(undefined4 *)((long)native_local + 0x18) = *(undefined4 *)((long)native + 4);
        *(undefined4 *)((long)native_local + 0x1c) = *(undefined4 *)((long)native + 0x18);
      }
    }
    else {
      p_free(native_local);
      native_local = (pconstpointer)0x0;
    }
  }
  return (PSocketAddress *)native_local;
}

Assistant:

P_LIB_API PSocketAddress *
p_socket_address_new_from_native (pconstpointer	native,
				  psize		len)
{
	PSocketAddress	*ret;
	puint16		family;

	if (P_UNLIKELY (native == NULL || len == 0))
		return NULL;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocketAddress))) == NULL))
		return NULL;

	family = ((const struct sockaddr *) native)->sa_family;

	if (family == AF_INET) {
		if (len < sizeof (struct sockaddr_in)) {
			P_WARNING ("PSocketAddress::p_socket_address_new_from_native: invalid IPv4 native size");
			p_free (ret);
			return NULL;
		}

		memcpy (&ret->addr.sin_addr, &((const struct sockaddr_in *) native)->sin_addr, sizeof (struct in_addr));
		ret->family = P_SOCKET_FAMILY_INET;
		ret->port   = p_ntohs (((struct sockaddr_in *) native)->sin_port);
		return ret;
	}
#ifdef AF_INET6
	else if (family == AF_INET6) {
		if (len < sizeof (struct sockaddr_in6)) {
			P_WARNING ("PSocketAddress::p_socket_address_new_from_native: invalid IPv6 native size");
			p_free (ret);
			return NULL;
		}

		memcpy (&ret->addr.sin6_addr,
			&((struct sockaddr_in6 *) native)->sin6_addr,
			sizeof (struct in6_addr));

		ret->family   = P_SOCKET_FAMILY_INET6;
		ret->port     = p_ntohs (((struct sockaddr_in *) native)->sin_port);
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_FLOWINFO
		ret->flowinfo = ((struct sockaddr_in6 *) native)->sin6_flowinfo;
#endif
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID
		ret->scope_id = ((struct sockaddr_in6 *) native)->sin6_scope_id;
#endif
		return ret;
	}
#endif
	else {
		p_free (ret);
		return NULL;
	}
}